

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O2

void pzgeom::TPZQuadraticTetra::TShape<double>
               (TPZVec<double> *par,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pdVar3 = par->fStore;
  dVar5 = *pdVar3;
  dVar1 = pdVar3[1];
  dVar2 = pdVar3[2];
  dVar10 = dVar5 + dVar5;
  pdVar3 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar3 = (dVar2 + dVar2 + dVar1 + dVar1 + dVar10 + -1.0) * (dVar1 + dVar2 + dVar5 + -1.0);
  pdVar3 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar3 = (dVar10 + -1.0) * dVar5;
  pdVar3 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar3 = (dVar1 + dVar1 + -1.0) * dVar1;
  pdVar3 = TPZFMatrix<double>::operator()(phi,3,0);
  *pdVar3 = (dVar2 + dVar2 + -1.0) * dVar2;
  dVar11 = dVar5 * -4.0;
  dVar4 = dVar5 + dVar1 + dVar2 + -1.0;
  pdVar3 = TPZFMatrix<double>::operator()(phi,4,0);
  *pdVar3 = dVar11 * dVar4;
  dVar5 = dVar5 * 4.0;
  pdVar3 = TPZFMatrix<double>::operator()(phi,5,0);
  *pdVar3 = dVar5 * dVar1;
  dVar6 = dVar1 * -4.0;
  pdVar3 = TPZFMatrix<double>::operator()(phi,6,0);
  *pdVar3 = dVar6 * dVar4;
  dVar7 = dVar2 * -4.0;
  pdVar3 = TPZFMatrix<double>::operator()(phi,7,0);
  *pdVar3 = dVar7 * dVar4;
  pdVar3 = TPZFMatrix<double>::operator()(phi,8,0);
  *pdVar3 = dVar5 * dVar2;
  dVar8 = dVar1 * 4.0;
  pdVar3 = TPZFMatrix<double>::operator()(phi,9,0);
  *pdVar3 = dVar8 * dVar2;
  dVar9 = dVar2 * 4.0;
  dVar12 = dVar5 + -3.0 + dVar8 + dVar9;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar3 = dVar12;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,0);
  *pdVar3 = dVar12;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,0);
  *pdVar3 = dVar12;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar3 = dVar5 + -1.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,1);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,1);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,2);
  *pdVar3 = dVar8 + -1.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,2);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,3);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,3);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,3);
  *pdVar3 = dVar9 + -1.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,4);
  *pdVar3 = (dVar10 + dVar1 + dVar2 + -1.0) * -4.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,4);
  *pdVar3 = dVar11;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,4);
  *pdVar3 = dVar11;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,5);
  *pdVar3 = dVar8;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,5);
  *pdVar3 = dVar5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,5);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,6);
  *pdVar3 = dVar6;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,6);
  *pdVar3 = dVar4 * -4.0 - dVar8;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,6);
  *pdVar3 = dVar6;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,7);
  *pdVar3 = dVar7;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,7);
  *pdVar3 = dVar7;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,7);
  *pdVar3 = dVar4 * -4.0 - dVar9;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,8);
  *pdVar3 = dVar9;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,8);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,8);
  *pdVar3 = dVar5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,9);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,9);
  *pdVar3 = dVar9;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,9);
  *pdVar3 = dVar8;
  return;
}

Assistant:

void TPZQuadraticTetra::TShape(const TPZVec<T> &par, TPZFMatrix<T> &phi, TPZFMatrix<T> &dphi)
{
	T qsi = par[0], eta = par[1], zeta = par[2];
	
    phi(0,0)  =  (zeta + eta + qsi -1.) * (2.*zeta + 2.*eta + 2.*qsi - 1.);
//    phi(0,0)  =  (qsi + eta + zeta -1.) * (2.*qsi + 2.*eta + 2.*zeta - 1.);
//    phi(0,0)  =  2.*qsi*qsi + 2.*eta*eta + 2.*zeta*zeta + 4.*qsi*eta + 4.*qsi*zeta + 4.*eta*zeta - 3.*qsi - 3.*eta - 3.*zeta + 1.;
	phi(1,0)  =  qsi  * (2.*qsi - 1.);
	phi(2,0)  =  eta  * (2.*eta - 1.);
	phi(3,0)  =  zeta * (2.*zeta - 1.);
	phi(4,0)  = -4.*qsi  * (qsi + eta + zeta -1.);
	phi(5,0)  =  4.*qsi  *  eta;
	phi(6,0)  = -4.*eta  * (qsi + eta + zeta -1.);
	phi(7,0)  = -4.*zeta * (qsi + eta + zeta -1.);
	phi(8,0)  =  4.*qsi  *  zeta;
	phi(9,0)  =  4.*eta  *  zeta;
	
	dphi(0,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(1,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(2,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(0,1) =  -1. + 4.*qsi;
	dphi(1,1) =   0.;
	dphi(2,1) =   0.;
	dphi(0,2) =   0.;
	dphi(1,2) =  -1. + 4.*eta;
	dphi(2,2) =   0.;
	dphi(0,3) =   0.;
	dphi(1,3) =   0.;
	dphi(2,3) =  -1. + 4.*zeta;
	dphi(0,4) =  -4.*(2.*qsi + eta + zeta - 1.);
	dphi(1,4) =  -4.*qsi;
	dphi(2,4) =  -4.*qsi;
	dphi(0,5) =   4.*eta;
	dphi(1,5) =   4.*qsi;
	dphi(2,5) =   0.;
	dphi(0,6) =  -4.*eta;
	dphi(1,6) =  -4.*(qsi + eta + zeta - 1.)-4.*eta;
	dphi(2,6) =  -4.*eta;
	dphi(0,7) =  -4.*zeta;
	dphi(1,7) =  -4.*zeta;
	dphi(2,7) =  -4.*(qsi + eta + zeta - 1.)-4.*zeta;
	dphi(0,8) =   4.*zeta;
	dphi(1,8) =   0.;
	dphi(2,8) =   4.*qsi;
	dphi(0,9) =   0.;
	dphi(1,9) =   4.*zeta;
	dphi(2,9) =   4.*eta;
}